

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O0

void __thiscall
Engine_testSetDoubleTagsVector_Test::~Engine_testSetDoubleTagsVector_Test
          (Engine_testSetDoubleTagsVector_Test *this)

{
  void *in_RDI;
  
  ~Engine_testSetDoubleTagsVector_Test((Engine_testSetDoubleTagsVector_Test *)0x1304a8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(Engine, testSetDoubleTagsVector) {
    Engine e("test", std::move(std::make_unique<TestHandler>()));
    std::vector<Tag> tags;
    tags.reserve(2);
    Tag::appendTag(tags, "Foo", "Bar");
    Tag::appendTag(tags, "Hello", "World");
    e.Set("gauge.value", 100.0005, tags);
    const auto &h = e.GetHandlers()[0];
    auto *th = dynamic_cast<TestHandler *>(h.get());
    ASSERT_EQ(1, th->doubleMeasures.size());
    auto im = th->doubleMeasures[0];
    ASSERT_EQ("test.gauge.value", im.name);
    ASSERT_EQ(MetricType::Gauge, im.type);
    ASSERT_EQ(1, im.rate);
    ASSERT_EQ(100.0005, im.value);
    ASSERT_EQ(2, im.tags.size());
    ASSERT_EQ("Foo", im.tags[0].name);
    ASSERT_EQ("Bar", im.tags[0].value);
    ASSERT_EQ("Hello", im.tags[1].name);
    ASSERT_EQ("World", im.tags[1].value);
}